

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SMPTEAnalyzerResults::fillSMPTE(SMPTEAnalyzerResults *this,Frame *frame,char *resultstr)

{
  byte bVar1;
  size_t sVar2;
  Frame *pFVar3;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar4;
  char local_232;
  char local_228 [8];
  char buff [128];
  uint local_1a0;
  U32 i_1;
  U32 p;
  U8 c;
  U8 *m;
  char local_188 [4];
  int i;
  char str2 [128];
  char str [128];
  int msk [8];
  int max [8];
  char *resultstr_local;
  Frame *frame_local;
  SMPTEAnalyzerResults *this_local;
  
  msk[6] = 9;
  msk[7] = 4;
  str[0x78] = '\x0f';
  str[0x79] = '\0';
  str[0x7a] = '\0';
  str[0x7b] = '\0';
  str[0x7c] = '\x03';
  str[0x7d] = '\0';
  str[0x7e] = '\0';
  str[0x7f] = '\0';
  msk[0] = 0xf;
  msk[1] = 7;
  msk[2] = 0xf;
  msk[3] = 7;
  msk[4] = 0xf;
  msk[5] = 3;
  pFVar3 = frame + 0x10;
  memset(str2 + 0x78,0,0x80);
  for (m._4_4_ = 7; uVar4 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20), -1 < m._4_4_;
      m._4_4_ = m._4_4_ + -1) {
    bVar1 = (byte)pFVar3[m._4_4_] & (byte)msk[(long)m._4_4_ + -2];
    if (msk[(long)m._4_4_ + 6] < (int)(uint)bVar1) {
      i_1._3_1_ = '?';
    }
    else {
      i_1._3_1_ = bVar1 + 0x30;
    }
    sVar2 = strlen(str2 + 0x78);
    str2[sVar2 + 0x78] = i_1._3_1_;
    if ((m._4_4_ != 0) && (m._4_4_ % 2 == 0)) {
      local_232 = '.';
      if (m._4_4_ != 2) {
        local_232 = ':';
      }
      sVar2 = strlen(str2 + 0x78);
      str2[sVar2 + 0x78] = local_232;
    }
  }
  if (resultstr == (char *)0x0) {
    AnalyzerResults::AddResultString
              ((char *)this,"T",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TS",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str2 + 0x7e,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,str2 + 0x7b,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    uVar4 = 0;
    AnalyzerResults::AddResultString
              ((char *)this,str2 + 0x78,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  strcpy(local_188,str2 + 0x78);
  if (((byte)frame[0x11] & 4) == 0) {
    strncat(local_188," no-drop",0x7f);
  }
  else {
    strncat(str2 + 0x78,"d",0x7f);
    strncat(local_188," drop",0x7f);
  }
  if (((byte)frame[0x11] & 8) == 0) {
    strncat(local_188," no-colour",0x7f);
  }
  else {
    strncat(str2 + 0x78,"c",0x7f);
    strncat(local_188," colour",0x7f);
  }
  local_1a0 = 1;
  buff[0x7c] = '\0';
  buff[0x7d] = '\0';
  buff[0x7e] = '\0';
  buff[0x7f] = '\0';
  for (; (uint)buff._124_4_ < 8; buff._124_4_ = buff._124_4_ + 1) {
    local_1a0 = (byte)pFVar3[(uint)buff._124_4_] ^ local_1a0;
  }
  local_1a0 = local_1a0 >> 4 ^ local_1a0;
  local_1a0 = local_1a0 >> 2 ^ local_1a0;
  if (((local_1a0 >> 1 ^ local_1a0) & 1) == 0) {
    strncat(str2 + 0x78,"p",0x7f);
    strncat(local_188," parity-ok",0x7f);
  }
  else {
    strncat(str2 + 0x78," P",0x7f);
    strncat(local_188," Parity-FAIL!",0x7f);
  }
  snprintf(local_228,0x80," User=%X-%X-%X-%X-%X-%X-%X-%X, groupBits=%d%d, reserved=%d",
           (ulong)(uint)((int)(uint)(byte)*pFVar3 >> 4),
           (ulong)(uint)((int)(uint)(byte)frame[0x11] >> 4),
           (ulong)(uint)((int)(uint)(byte)frame[0x12] >> 4),
           CONCAT44(uVar4,(int)(uint)(byte)frame[0x13] >> 4),(int)(uint)(byte)frame[0x14] >> 4,
           (int)(uint)(byte)frame[0x15] >> 4,(int)(uint)(byte)frame[0x16] >> 4,
           (int)(uint)(byte)frame[0x17] >> 4,(uint)(((byte)frame[0x15] & 8) != 0),
           (uint)(((byte)frame[0x17] & 8) != 0),(uint)(((byte)frame[0x17] & 4) != 0));
  strncat(local_188,local_228,0x7f);
  if (resultstr == (char *)0x0) {
    AnalyzerResults::AddResultString
              ((char *)this,str2 + 0x78,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_188,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(resultstr,local_188);
  }
  return;
}

Assistant:

void SMPTEAnalyzerResults::fillSMPTE(Frame frame, char * resultstr) 
{
	//                    frame     seconds   minutes   hours  
	const int max[8] = {   9,   4,   9,   5,   9,   5,   9,   2 };
	const int msk[8] = { 0xF, 0x3, 0xF, 0x7, 0xF, 0x7, 0xF, 0x3 };

	char str[128];
	char str2[128];
	int i;

	// We avoid direct bit operations on mData - as we're not
	// sure of the byte order of the varios platforms.
	//
	U8 *m = (U8*)&(frame.mData1);

	bzero(str, sizeof(str));
	for(i = 7; i >= 0; i--) {
		U8 c = m[i] & msk[i];
		if (c <= max[i])
			c += '0';
		else
			c = '?';
		str[ strlen(str) ] = c;

		if (i && (i %2) == 0) {
			str[ strlen(str) ] = (i == 2) ? '.' : ':';
		};
	};
	if (!resultstr) {
		AddResultString("T");
		AddResultString("TS");
		AddResultString( str + 8); // Just the .framecount
		AddResultString( str + 6); // Seconds, frames
		AddResultString( str + 3); // min/seconds/frames
		AddResultString( str );	   // whole HMS.frame
	};
	
	// From here we work on an abridge string and a fully
	// elaborated string in parallel.
	//	
	strcpy(str2,str);

	if (BIT(m,DROPBIT)) {
		strncat(str,"d", sizeof(str)-1);
		strncat(str2," drop", sizeof(str)-1);
	} else {
		strncat(str2," no-drop", sizeof(str)-1);
	};

	if (BIT(m,COLBIT)) {
		strncat(str,"c", sizeof(str)-1);
		strncat(str2," colour", sizeof(str)-1);
	} else {
		strncat(str2," no-colour", sizeof(str)-1);
	};
	
	// stick to machine byte order indepennt method.
	//
	// U64 p = frame.mData1; p ^= p >> 32; p ^= p >> 8; p ^= p >> 4; p ^= p >> 2; p ^= p >> 1; 
	//
	U32 p = 1; // for bte 8 & 9
	for(U32 i = 0; i < 8; i++) p ^= m[i];
	p ^= p >> 4; p ^= p >> 2; p ^= p >> 1; 

	// Should be an even number of bits; if we include
	// the parity bit in the list./
	//
	if ((p & 1) == 0) {
		strncat(str,"p", sizeof(str)-1);
		strncat(str2," parity-ok", sizeof(str2)-1);
	} else {
		strncat(str," P", sizeof(str)-1);
		strncat(str2," Parity-FAIL!", sizeof(str2)-1);
	};
	char buff[128];
	snprintf(buff,sizeof(buff)," User=%X-%X-%X-%X-%X-%X-%X-%X, groupBits=%d%d, reserved=%d",
			       //  0 ..  3  -- L frame
		(m[0]>>4)&0xF, //  4 ..  7     user 1
			       //  8 ..  9  -- H frame
			       //  10          drop frame
			       //  11          colour
		(m[1]>>4)&0xF, // 12 .. 15     user 2
			       // 16 .. 19     L sec
		(m[2]>>4)&0xF, // 20 .. 23     user 3
			       // 24 .. 26     H sec
                               //              parity bit
		(m[3]>>4)&0xF, // 28 .. 31     user 4
			       // 32 .. 35     L min
		(m[4]>>4)&0xF, // 36 .. 39     user 5
			       // 40 .. 42     H min
                               // 43           group bit 
		(m[5]>>4)&0xF, // 44 .. 47     user 6
			       // 47 .. 51     L hour
		(m[6]>>4)&0xF, // 52 .. 55     user 7
			       // 56 .. 57     H hour
                               // 58           reserved
                               // 59           group bit
		(m[7]>>4)&0xF, // 60 .. 63     user 8
			       // 64 .. 79     code words (16 bits)
		BIT(m,GR1BIT), // 43 - group bit
		BIT(m,GR2BIT), // 59 - group bit
		BIT(m,RESBIT)  // 58 - reserved
	);
	strncat(str2, buff, sizeof(str2)-1);

	if (!resultstr) {
		AddResultString( str );
		AddResultString( str2 );
	} else {
		strcpy(resultstr, str2);
	};
}